

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapBit
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  bool bVar1;
  bool bVar2;
  FieldDescriptor *in_RSI;
  Message *in_RDI;
  Reflection *unaff_retaddr;
  bool temp_has_bit;
  FieldDescriptor *in_stack_00000040;
  Message *in_stack_00000048;
  Reflection *in_stack_00000050;
  
  bVar1 = internal::ReflectionSchema::HasHasbits((ReflectionSchema *)(in_RDI + 1));
  if (bVar1) {
    bVar1 = HasBit(in_stack_00000050,in_stack_00000048,in_stack_00000040);
    bVar2 = HasBit(in_stack_00000050,in_stack_00000048,in_stack_00000040);
    if (bVar2) {
      SetBit(unaff_retaddr,in_RDI,in_RSI);
    }
    else {
      ClearBit(unaff_retaddr,in_RDI,in_RSI);
    }
    if (bVar1) {
      SetBit(unaff_retaddr,in_RDI,in_RSI);
    }
    else {
      ClearBit(unaff_retaddr,in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

void Reflection::SwapBit(Message* message1, Message* message2,
                         const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  bool temp_has_bit = HasBit(*message1, field);
  if (HasBit(*message2, field)) {
    SetBit(message1, field);
  } else {
    ClearBit(message1, field);
  }
  if (temp_has_bit) {
    SetBit(message2, field);
  } else {
    ClearBit(message2, field);
  }
}